

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Chapters::Atom::ExpandDisplaysArray(Atom *this)

{
  int iVar1;
  uint uVar2;
  Display *pDVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  int iVar9;
  Display *pDVar10;
  bool bVar11;
  
  iVar1 = this->m_displays_size;
  uVar2 = this->m_displays_count;
  bVar11 = true;
  if (iVar1 <= (int)uVar2) {
    iVar9 = 1;
    if (iVar1 != 0) {
      iVar9 = iVar1 * 2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar9;
    uVar5 = SUB168(auVar4 * ZEXT816(0x18),0);
    uVar6 = uVar5 + 8;
    if (0xfffffffffffffff7 < uVar5) {
      uVar6 = 0xffffffffffffffff;
    }
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar5 = uVar6;
    }
    puVar7 = (ulong *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    if (puVar7 == (ulong *)0x0) {
      pDVar10 = (Display *)0x0;
    }
    else {
      *puVar7 = (long)iVar9;
      pDVar10 = (Display *)(puVar7 + 1);
    }
    bVar11 = pDVar10 != (Display *)0x0;
    if (bVar11) {
      if (0 < (int)uVar2) {
        pDVar3 = this->m_displays;
        lVar8 = 0;
        do {
          *(undefined8 *)((long)&pDVar10->m_string + lVar8) =
               *(undefined8 *)((long)&pDVar3->m_string + lVar8);
          *(undefined8 *)((long)&pDVar10->m_language + lVar8) =
               *(undefined8 *)((long)&pDVar3->m_language + lVar8);
          *(undefined8 *)((long)&pDVar10->m_country + lVar8) =
               *(undefined8 *)((long)&pDVar3->m_country + lVar8);
          lVar8 = lVar8 + 0x18;
        } while ((ulong)uVar2 * 0x18 != lVar8);
      }
      if (this->m_displays != (Display *)0x0) {
        operator_delete__(&this->m_displays[-1].m_country);
      }
      this->m_displays = pDVar10;
      this->m_displays_size = iVar9;
    }
  }
  return bVar11;
}

Assistant:

bool Chapters::Atom::ExpandDisplaysArray() {
  if (m_displays_size > m_displays_count)
    return true;  // nothing else to do

  const int size = (m_displays_size == 0) ? 1 : 2 * m_displays_size;

  Display* const displays = new (std::nothrow) Display[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_displays_count; ++idx) {
    m_displays[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_displays;
  m_displays = displays;

  m_displays_size = size;
  return true;
}